

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m2v_L_mult_inplace(m2v *LU,m2v *X_inout)

{
  int r;
  int iVar1;
  int iVar2;
  
  iVar1 = LU->n_row;
  while (0 < iVar1) {
    r = iVar1 + -1;
    if (LU->n_col < iVar1) {
      m2v_clear_row(X_inout,r);
      iVar2 = LU->n_col;
      while (iVar1 = r, 0 < iVar2) {
        iVar2 = iVar2 + -1;
        iVar1 = m2v_get_el(LU,r,iVar2);
        m2v_multadd_row(X_inout,iVar2,iVar1,X_inout,r);
      }
    }
    else {
      for (iVar2 = iVar1 + -2; iVar1 = r, -1 < iVar2; iVar2 = iVar2 + -1) {
        iVar1 = m2v_get_el(LU,r,iVar2);
        m2v_multadd_row(X_inout,iVar2,iVar1,X_inout,r);
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_L_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			MV_GEN_N(_clear_row)(X_inout /* Y */, i);
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		}
	}
}